

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O3

void __thiscall ChatServer::ChatServer(ChatServer *this)

{
  _Rb_tree_header *p_Var1;
  Stream *pSVar2;
  long *local_38 [2];
  long local_28 [2];
  
  Dashel::Hub::Hub(&this->super_Hub,true);
  *(undefined ***)this = &PTR__ChatServer_00106d40;
  p_Var1 = &(this->nicks)._M_t._M_impl.super__Rb_tree_header;
  (this->nicks)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->nicks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->nicks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->nicks)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->nicks)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"tcpin:port=8765","");
  pSVar2 = (Stream *)Dashel::Hub::connect((string *)this);
  this->listenStream = pSVar2;
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

ChatServer()
	{
		listenStream = connect("tcpin:port=8765");
	}